

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O1

RK_S32 av1_extract_obu(AV1OBU *obu,uint8_t *buf,RK_S32 length)

{
  RK_S32 RVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  RK_S32 spatial_id;
  RK_S32 temporal_id;
  RK_S32 local_ac;
  RK_S32 type;
  RK_S32 has_size_flag;
  RK_S32 extension_flag;
  RK_S32 byte;
  uint8_t *local_98;
  RK_S32 value;
  BitReadCtx_t gb;
  
  uVar4 = (ulong)(uint)length;
  value = 0;
  RVar1 = 10;
  if (length < 10) {
    RVar1 = length;
  }
  mpp_set_bitread_ctx(&gb,buf,RVar1);
  mpp_read_bits(&gb,1,&value);
  iVar3 = -0x3ef;
  if (value == 0) {
    mpp_read_bits(&gb,4,&type);
    mpp_read_bits(&gb,1,&extension_flag);
    mpp_read_bits(&gb,1,&has_size_flag);
    mpp_skip_bits(&gb,1);
    if (extension_flag == 0) {
      spatial_id = 0;
      temporal_id = 0;
    }
    else {
      mpp_read_bits(&gb,3,&temporal_id);
      mpp_read_bits(&gb,2,&spatial_id);
      mpp_skip_bits(&gb,3);
    }
    local_ac = length;
    if (has_size_flag == 0) {
      uVar4 = (ulong)(~extension_flag + length);
    }
    else {
      byte = 0;
      uVar4 = 0;
      lVar2 = 0;
      local_98 = buf;
      do {
        mpp_read_bits(&gb,8,&byte);
        uVar4 = (ulong)(byte & 0x7f) << ((byte)lVar2 & 0x3f) | uVar4;
        buf = local_98;
        if (-1 < (char)byte) break;
        bVar5 = lVar2 != 0x31;
        lVar2 = lVar2 + 7;
      } while (bVar5);
    }
    iVar3 = -0x3ef;
    RVar1 = mpp_get_bits_left(&gb);
    if (RVar1 < 0) {
      lVar2 = 0;
    }
    else {
      RVar1 = mpp_get_bits_count(&gb);
      iVar3 = RVar1 + 7;
      if (-1 < RVar1) {
        iVar3 = RVar1;
      }
      lVar2 = (long)(iVar3 >> 3);
      iVar3 = -0x3ef;
      if ((long)(uVar4 + lVar2) <= (long)local_ac) {
        iVar3 = (int)(uVar4 + lVar2);
      }
    }
  }
  else {
    lVar2 = 0;
  }
  if (-1 < iVar3) {
    obu->type = type;
    obu->temporal_id = temporal_id;
    obu->spatial_id = spatial_id;
    obu->data = buf + lVar2;
    obu->size = (int)uVar4;
    obu->raw_data = buf;
    obu->raw_size = iVar3;
    if (((byte)av1d_debug & 8) != 0) {
      _mpp_log_l(4,"av1d_parser","obu_type: %d, temporal_id: %d, spatial_id: %d, payload size: %d\n"
                 ,"av1_extract_obu",(ulong)(uint)type,(ulong)(uint)temporal_id,
                 (ulong)(uint)spatial_id,uVar4);
    }
  }
  return iVar3;
}

Assistant:

RK_S32 av1_extract_obu(AV1OBU *obu, uint8_t *buf, RK_S32 length)
{
    int64_t obu_size;
    RK_S32 start_pos, type, temporal_id, spatial_id;
    RK_S32 len;

    len = parse_obu_header(buf, length, &obu_size, &start_pos,
                           &type, &temporal_id, &spatial_id);
    if (len < 0)
        return len;

    obu->type        = type;
    obu->temporal_id = temporal_id;
    obu->spatial_id  = spatial_id;

    obu->data     = buf + start_pos;
    obu->size     = obu_size;
    obu->raw_data = buf;
    obu->raw_size = len;

    av1d_dbg(AV1D_DBG_STRMIN, "obu_type: %d, temporal_id: %d, spatial_id: %d, payload size: %d\n",
             obu->type, obu->temporal_id, obu->spatial_id, obu->size);

    return len;
}